

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detectionoutput.cpp
# Opt level: O1

int __thiscall
ncnn::DetectionOutput::forward
          (DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  BBoxRect *pBVar1;
  vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *this_00;
  vector<float,std::allocator<float>> *this_01;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  int iVar7;
  pointer pMVar8;
  unsigned_long uVar9;
  iterator __position;
  iterator __position_00;
  Mat *this_02;
  size_t sVar10;
  long lVar11;
  bool bVar12;
  pointer pfVar13;
  pointer pvVar14;
  int iVar15;
  int *piVar16;
  float *pfVar17;
  float *pfVar18;
  pointer pfVar19;
  int iVar20;
  BBoxRect *pBVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  size_type sVar26;
  long lVar27;
  uint uVar28;
  float *pfVar29;
  ulong uVar30;
  size_type __new_size;
  float fVar31;
  float fVar32;
  undefined4 extraout_XMM0_Db;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<float,_std::allocator<float>_> class_bbox_scores;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_class_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_class_bbox_rects;
  vector<float,_std::allocator<float>_> local_1e8;
  vector<float,_std::allocator<float>_> local_1c8;
  DetectionOutput *local_1a8;
  uint local_19c;
  unsigned_long *local_198;
  iterator iStack_190;
  unsigned_long *local_188;
  unsigned_long local_180;
  int local_174;
  ulong local_170;
  vector<float,_std::allocator<float>_> local_168;
  size_type local_150;
  Mat local_148;
  undefined8 local_f8;
  void *local_e0;
  ulong local_d8;
  pointer local_d0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_c8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_90;
  Option *local_88;
  void *local_80;
  float *local_78;
  void *local_70;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar7 = this->num_class;
  if (iVar7 == -0xe9) {
    local_19c = pMVar8[2].h;
    local_170 = (ulong)local_19c;
  }
  else {
    iVar15 = pMVar8[2].w;
    iVar20 = iVar15 + 3;
    if (-1 < iVar15) {
      iVar20 = iVar15;
    }
    local_19c = iVar20 >> 2;
    local_170 = 1;
  }
  piVar16 = &this->num_class;
  if (iVar7 == -0xe9) {
    piVar16 = &pMVar8[1].h;
  }
  local_150 = (size_type)*piVar16;
  local_148.cstep = 0;
  local_148.data = (float *)0x0;
  local_148.refcount._0_4_ = 0;
  local_148.refcount._4_4_ = 0;
  local_148.elemsize._0_4_ = 0;
  local_148.elemsize._4_4_ = 0;
  local_148.elempack = 0;
  local_148.allocator = (Allocator *)0x0;
  local_148.dims = 0;
  local_148.w = 0;
  local_148.h = 0;
  local_148.d = 0;
  local_148.c = 0;
  local_1a8 = this;
  local_88 = opt;
  Mat::create(&local_148,4,local_19c,4,opt->workspace_allocator);
  iVar15 = -100;
  if (((float *)local_148.data != (float *)0x0) && ((long)local_148.c * local_148.cstep != 0)) {
    local_70 = pMVar8[2].data;
    if (iVar7 == -0xe9) {
      local_e0 = (void *)0x0;
    }
    else {
      local_e0 = (void *)((long)pMVar8[2].w * pMVar8[2].elemsize + (long)local_70);
    }
    local_d8 = (ulong)local_19c;
    local_174 = iVar7;
    local_d0 = pMVar8;
    local_90 = top_blobs;
    if (0 < (int)local_19c) {
      local_80 = pMVar8->data;
      local_78 = local_1a8->variances;
      lVar27 = (long)local_148.w;
      iVar15 = 1;
      if (iVar7 != -0xe9) {
        iVar15 = (int)local_150;
      }
      pfVar18 = (float *)pMVar8[1].data;
      lVar11 = CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
      lVar22 = local_d8 << 4;
      lVar25 = 0;
      pfVar29 = (float *)local_148.data;
      do {
        if (*pfVar18 < 1.0 - local_1a8->confidence_threshold) {
          pfVar17 = (float *)((long)local_e0 + lVar25);
          if (local_e0 == (void *)0x0) {
            pfVar17 = local_78;
          }
          local_a8 = CONCAT44((float)((ulong)*(undefined8 *)((long)local_80 + lVar25) >> 0x20) *
                              (float)((ulong)*(undefined8 *)pfVar17 >> 0x20),
                              (float)*(undefined8 *)((long)local_80 + lVar25) *
                              (float)*(undefined8 *)pfVar17);
          uStack_a0 = 0;
          uVar5 = *(undefined8 *)((long)local_80 + lVar25 + 8);
          fVar32 = (float)((ulong)uVar5 >> 0x20) *
                   (float)((ulong)*(undefined8 *)(pfVar17 + 2) >> 0x20);
          local_48 = CONCAT44(fVar32,(float)uVar5 * (float)*(undefined8 *)(pfVar17 + 2));
          uStack_40 = 0;
          fVar32 = expf(fVar32);
          local_f8 = CONCAT44(extraout_XMM0_Db,fVar32);
          fVar32 = expf((float)local_48);
          pfVar17 = (float *)((long)local_70 + lVar25);
          fVar34 = pfVar17[2] - *pfVar17;
          fVar35 = pfVar17[3] - pfVar17[1];
          fVar31 = (*pfVar17 + pfVar17[2]) * 0.5 + fVar34 * (float)local_a8;
          fVar33 = (pfVar17[1] + pfVar17[3]) * 0.5 + fVar35 * local_a8._4_4_;
          fVar32 = fVar32 * fVar34 * 0.5;
          fVar34 = (float)local_f8 * fVar35 * 0.5;
          *pfVar29 = fVar31 - fVar32;
          pfVar29[1] = fVar33 - fVar34;
          pfVar29[2] = fVar31 + fVar32;
          pfVar29[3] = fVar33 + fVar34;
        }
        pfVar18 = pfVar18 + iVar15;
        lVar25 = lVar25 + 0x10;
        pfVar29 = (float *)((long)pfVar29 + lVar27 * lVar11);
      } while (lVar22 != lVar25);
    }
    __new_size = local_150;
    local_68.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize(&local_68,local_150);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&local_c8,__new_size);
    if (1 < (int)__new_size) {
      uVar23 = 1;
      if (local_174 != -0xe9) {
        uVar23 = __new_size & 0xffffffff;
      }
      local_170 = local_170 << 2;
      sVar26 = 1;
      local_f8 = local_170;
      do {
        local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (float *)0x0;
        local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (float *)0x0;
        if (0 < (int)local_19c) {
          uVar30 = 0;
          uVar24 = local_f8;
          do {
            fVar32 = *(float *)((long)local_d0[1].data + uVar24);
            local_198 = (unsigned_long *)CONCAT44(local_198._4_4_,fVar32);
            if (local_1a8->confidence_threshold <= fVar32 &&
                fVar32 != local_1a8->confidence_threshold) {
              lVar27 = (long)local_148.w * uVar30 *
                       CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
              local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(*(undefined4 *)((long)local_148.data + lVar27 + 4),
                                     *(float *)((long)local_148.data + lVar27));
              local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)CONCAT44(*(undefined4 *)((long)local_148.data + lVar27 + 0xc),
                                     *(undefined4 *)((long)local_148.data + lVar27 + 8));
              local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)CONCAT44(local_1c8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                     (int)sVar26);
              if (local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
                _M_realloc_insert<ncnn::BBoxRect_const&>
                          ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_1e8,
                           (iterator)
                           local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(BBoxRect *)&local_1c8);
              }
              else {
                *(int *)((long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish + 0x10) = (int)sVar26;
                *(pointer *)
                 local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish =
                     local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
                *(pointer *)
                 ((long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish + 8) =
                     local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)((long)local_1e8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish + 0x14);
              }
              if (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&local_168,
                           (iterator)
                           local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)&local_198);
              }
              else {
                *local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_198._0_4_;
                local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            uVar30 = uVar30 + 1;
            uVar24 = uVar24 + uVar23 * 4;
          } while (local_d8 != uVar30);
        }
        qsort_descent_inplace<ncnn::BBoxRect>
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_1e8,&local_168)
        ;
        iVar7 = local_1a8->nms_top_k;
        iVar15 = (int)((ulong)((long)local_1e8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1e8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        if (SBORROW4(iVar7,iVar15 * -0x33333333) != iVar7 + iVar15 * 0x33333333 < 0) {
          std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                    ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_1e8,
                     (long)iVar7);
          std::vector<float,_std::allocator<float>_>::resize(&local_168,(long)local_1a8->nms_top_k);
        }
        pfVar13 = local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pfVar19 = local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_198 = (unsigned_long *)0x0;
        local_188 = (unsigned_long *)0x0;
        iStack_190._M_current = (unsigned_long *)0x0;
        local_a8 = CONCAT44(local_a8._4_4_,local_1a8->nms_threshold);
        uVar24 = ((long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
        std::vector<float,_std::allocator<float>_>::vector
                  (&local_1c8,uVar24,(allocator_type *)&local_180);
        if (pfVar13 == pfVar19) {
          local_180 = 0;
        }
        else {
          pfVar18 = (float *)((long)local_1e8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8);
          lVar27 = 0;
          do {
            uVar4 = ((BBoxRect *)(pfVar18 + -2))->xmin;
            uVar6 = ((BBoxRect *)(pfVar18 + -2))->ymin;
            local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[lVar27] =
                 ((float)((ulong)*(undefined8 *)pfVar18 >> 0x20) - (float)uVar6) *
                 ((float)*(undefined8 *)pfVar18 - (float)uVar4);
            lVar27 = lVar27 + 1;
            pfVar18 = pfVar18 + 5;
          } while (uVar24 + (uVar24 == 0) != lVar27);
          local_180 = 0;
          if (pfVar13 != pfVar19) {
            do {
              uVar28 = (uint)((ulong)((long)iStack_190._M_current - (long)local_198) >> 3);
              if ((int)uVar28 < 1) {
LAB_0048d892:
                if (iStack_190._M_current == local_188) {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long_const&>
                            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_198,
                             iStack_190,&local_180);
                }
                else {
                  *iStack_190._M_current = local_180;
                  iStack_190._M_current = iStack_190._M_current + 1;
                }
              }
              else {
                pBVar21 = (BBoxRect *)
                          ((long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start + local_180 * 0x14);
                fVar32 = pBVar21->xmin;
                bVar12 = true;
                uVar30 = 0;
                do {
                  uVar9 = local_198[uVar30];
                  fVar31 = ((BBoxRect *)
                           ((long)local_1e8.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + uVar9 * 0x14))->xmax;
                  fVar33 = 0.0;
                  if (fVar32 <= fVar31) {
                    pBVar1 = (BBoxRect *)
                             ((long)local_1e8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + uVar9 * 0x14);
                    fVar34 = pBVar21->xmax;
                    fVar35 = pBVar1->xmin;
                    if (fVar35 <= fVar34) {
                      fVar2 = pBVar21->ymin;
                      fVar36 = pBVar1->ymax;
                      if (fVar2 <= fVar36) {
                        fVar3 = pBVar21->ymax;
                        fVar37 = pBVar1->ymin;
                        if (fVar37 <= fVar3) {
                          if (fVar34 <= fVar31) {
                            fVar31 = fVar34;
                          }
                          if (fVar35 <= fVar32) {
                            fVar35 = fVar32;
                          }
                          if (fVar3 <= fVar36) {
                            fVar36 = fVar3;
                          }
                          if (fVar37 <= fVar2) {
                            fVar37 = fVar2;
                          }
                          fVar33 = (fVar36 - fVar37) * (fVar31 - fVar35);
                        }
                      }
                    }
                  }
                  if ((float)local_a8 <
                      fVar33 / ((local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start[local_180] - fVar33) +
                               local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar9])) {
                    bVar12 = false;
                  }
                  uVar30 = uVar30 + 1;
                } while ((uVar28 & 0x7fffffff) != uVar30);
                if (bVar12) goto LAB_0048d892;
              }
              local_180 = local_180 + 1;
            } while (local_180 < uVar24);
          }
        }
        if (local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (iStack_190._M_current != local_198) {
          uVar24 = 0;
          do {
            uVar9 = local_198[uVar24];
            pBVar21 = (BBoxRect *)
                      ((long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar9 * 0x14);
            this_00 = (vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)
                      (local_68.
                       super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + sVar26);
            __position._M_current = *(BBoxRect **)(this_00 + 8);
            if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
              std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
              _M_realloc_insert<ncnn::BBoxRect_const&>(this_00,__position,pBVar21);
            }
            else {
              (__position._M_current)->label = pBVar21->label;
              fVar32 = pBVar21->ymin;
              fVar31 = pBVar21->xmax;
              fVar33 = pBVar21->ymax;
              (__position._M_current)->xmin = pBVar21->xmin;
              (__position._M_current)->ymin = fVar32;
              (__position._M_current)->xmax = fVar31;
              (__position._M_current)->ymax = fVar33;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x14;
            }
            this_01 = (vector<float,std::allocator<float>> *)
                      (local_c8.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + sVar26);
            __position_00._M_current = *(float **)(this_01 + 8);
            if (__position_00._M_current == *(float **)(this_01 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (this_01,__position_00,
                         local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar9);
            }
            else {
              *__position_00._M_current =
                   local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9];
              *(float **)(this_01 + 8) = __position_00._M_current + 1;
            }
            uVar24 = uVar24 + 1;
          } while (uVar24 < (ulong)((long)iStack_190._M_current - (long)local_198 >> 3));
        }
        if (local_198 != (unsigned_long *)0x0) {
          operator_delete(local_198,(long)local_188 - (long)local_198);
        }
        __new_size = local_150;
        if (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((BBoxRect *)
            local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (BBoxRect *)0x0) {
          operator_delete(local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        sVar26 = sVar26 + 1;
        local_f8 = local_f8 + local_170;
      } while (sVar26 != __new_size);
    }
    local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (1 < (int)__new_size) {
      lVar27 = 0;
      do {
        pvVar14 = local_c8.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>>
                  ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_1c8,
                   local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   *(undefined8 *)
                    ((long)&local_68.
                            super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].
                            super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar27),
                   *(undefined8 *)
                    ((long)&local_68.
                            super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].
                            super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                            _M_impl.super__Vector_impl_data._M_finish + lVar27));
        std::vector<float,std::allocator<float>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                  ((vector<float,std::allocator<float>> *)&local_1e8,
                   local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   *(undefined8 *)
                    ((long)&pvVar14[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar27),
                   *(undefined8 *)
                    ((long)&pvVar14[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish + lVar27));
        lVar27 = lVar27 + 0x18;
      } while (__new_size * 0x18 + -0x18 != lVar27);
    }
    qsort_descent_inplace<ncnn::BBoxRect>
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_1c8,&local_1e8);
    iVar7 = local_1a8->keep_top_k;
    iVar15 = (int)((ulong)((long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                          (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
    if (SBORROW4(iVar7,iVar15 * -0x33333333) != iVar7 + iVar15 * 0x33333333 < 0) {
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_1c8,(long)iVar7);
      std::vector<float,_std::allocator<float>_>::resize(&local_1e8,(long)local_1a8->keep_top_k);
    }
    uVar28 = (int)((long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2) * -0x33333333;
    iVar15 = 0;
    if (uVar28 != 0) {
      this_02 = (local_90->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_02,6,uVar28,4,local_88->blob_allocator);
      iVar15 = -100;
      if (((this_02->data != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) &&
         (iVar15 = 0, 0 < (int)uVar28)) {
        iVar7 = this_02->w;
        sVar10 = this_02->elemsize;
        pfVar19 = local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + 4;
        pfVar18 = (float *)((long)this_02->data + 0x14);
        iVar15 = 0;
        uVar23 = 0;
        do {
          fVar32 = local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar23];
          pfVar18[-5] = (float)(int)*pfVar19;
          pfVar18[-4] = fVar32;
          pfVar18[-3] = pfVar19[-4];
          pfVar18[-2] = pfVar19[-3];
          pfVar18[-1] = pfVar19[-2];
          *pfVar18 = pfVar19[-1];
          uVar23 = uVar23 + 1;
          pfVar19 = pfVar19 + 5;
          pfVar18 = (float *)((long)pfVar18 + (long)iVar7 * sVar10);
        } while ((uVar28 & 0x7fffffff) != uVar23);
      }
    }
    if (local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&local_c8);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector(&local_68);
  }
  piVar16 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        if ((float *)local_148.data != (float *)0x0) {
          free(local_148.data);
        }
      }
      else {
        (*(local_148.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar15;
}

Assistant:

int DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& location = bottom_blobs[0];
    const Mat& confidence = bottom_blobs[1];
    const Mat& priorbox = bottom_blobs[2];

    bool mxnet_ssd_style = num_class == -233;

    // mxnet-ssd _contrib_MultiBoxDetection
    const int num_prior = mxnet_ssd_style ? priorbox.h : priorbox.w / 4;

    int num_class_copy = mxnet_ssd_style ? confidence.h : num_class;

    // apply location with priorbox
    Mat bboxes;
    bboxes.create(4, num_prior, 4u, opt.workspace_allocator);
    if (bboxes.empty())
        return -100;

    const float* location_ptr = location;
    const float* priorbox_ptr = priorbox.row(0);
    const float* variance_ptr = mxnet_ssd_style ? 0 : priorbox.row(1);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_prior; i++)
    {
        // if score of background class is larger than confidence threshold
        float score = mxnet_ssd_style ? confidence[i] : confidence[static_cast<size_t>(i) * static_cast<size_t>(num_class_copy)];
        if (score >= (1.0 - confidence_threshold))
        {
            continue;
        }
        const float* loc = location_ptr + i * 4;
        const float* pb = priorbox_ptr + i * 4;
        const float* var = variance_ptr ? variance_ptr + i * 4 : variances;

        float* bbox = bboxes.row(i);

        // CENTER_SIZE
        float pb_w = pb[2] - pb[0];
        float pb_h = pb[3] - pb[1];
        float pb_cx = (pb[0] + pb[2]) * 0.5f;
        float pb_cy = (pb[1] + pb[3]) * 0.5f;

        float bbox_cx = var[0] * loc[0] * pb_w + pb_cx;
        float bbox_cy = var[1] * loc[1] * pb_h + pb_cy;
        float bbox_w = static_cast<float>(exp(var[2] * loc[2]) * pb_w);
        float bbox_h = static_cast<float>(exp(var[3] * loc[3]) * pb_h);

        bbox[0] = bbox_cx - bbox_w * 0.5f;
        bbox[1] = bbox_cy - bbox_h * 0.5f;
        bbox[2] = bbox_cx + bbox_w * 0.5f;
        bbox[3] = bbox_cy + bbox_h * 0.5f;
    }

    // sort and nms for each class
    std::vector<std::vector<BBoxRect> > all_class_bbox_rects;
    std::vector<std::vector<float> > all_class_bbox_scores;
    all_class_bbox_rects.resize(num_class_copy);
    all_class_bbox_scores.resize(num_class_copy);

    // start from 1 to ignore background class
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 1; i < num_class_copy; i++)
    {
        // filter by confidence_threshold
        std::vector<BBoxRect> class_bbox_rects;
        std::vector<float> class_bbox_scores;

        for (int j = 0; j < num_prior; j++)
        {
            // prob data layout
            // caffe-ssd = num_class x num_prior
            // mxnet-ssd = num_prior x num_class
            float score = mxnet_ssd_style ? confidence[i * num_prior + j] : confidence[j * num_class_copy + i];

            if (score > confidence_threshold)
            {
                const float* bbox = bboxes.row(j);
                BBoxRect c = {bbox[0], bbox[1], bbox[2], bbox[3], i};
                class_bbox_rects.push_back(c);
                class_bbox_scores.push_back(score);
            }
        }

        // sort inplace
        qsort_descent_inplace(class_bbox_rects, class_bbox_scores);

        // keep nms_top_k
        if (nms_top_k < (int)class_bbox_rects.size())
        {
            class_bbox_rects.resize(nms_top_k);
            class_bbox_scores.resize(nms_top_k);
        }

        // apply nms
        std::vector<size_t> picked;
        nms_sorted_bboxes(class_bbox_rects, picked, nms_threshold);

        // select
        for (size_t j = 0; j < picked.size(); j++)
        {
            size_t z = picked[j];
            all_class_bbox_rects[i].push_back(class_bbox_rects[z]);
            all_class_bbox_scores[i].push_back(class_bbox_scores[z]);
        }
    }

    // gather all class
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (int i = 1; i < num_class_copy; i++)
    {
        const std::vector<BBoxRect>& class_bbox_rects = all_class_bbox_rects[i];
        const std::vector<float>& class_bbox_scores = all_class_bbox_scores[i];

        bbox_rects.insert(bbox_rects.end(), class_bbox_rects.begin(), class_bbox_rects.end());
        bbox_scores.insert(bbox_scores.end(), class_bbox_scores.begin(), class_bbox_scores.end());
    }

    // global sort inplace
    qsort_descent_inplace(bbox_rects, bbox_scores);

    // keep_top_k
    if (keep_top_k < (int)bbox_rects.size())
    {
        bbox_rects.resize(keep_top_k);
        bbox_scores.resize(keep_top_k);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label);
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}